

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O2

char * __thiscall ODDLParser::OpenDDLParser::parseHeader(OpenDDLParser *this,char *in,char *end)

{
  char cVar1;
  char cVar2;
  pointer ppDVar3;
  __uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> __p;
  Text *this_00;
  char *pcVar4;
  DDLNode *node;
  ostream *poVar5;
  _Head_base<0UL,_ODDLParser::Property_*,_false> _Var6;
  DDLNode *parent;
  ulong uVar7;
  bool bVar8;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> first;
  unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> prev;
  unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> name;
  Property *prop_;
  string type;
  Name *name_;
  Text *id;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_c0;
  allocator local_b1;
  __uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> local_b0;
  _Head_base<0UL,_ODDLParser::Property_*,_false> local_a8;
  __uniq_ptr_impl<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> local_a0;
  ulong local_98;
  DDLNode *local_90;
  Property *local_88;
  string local_80;
  OpenDDLParser *local_60;
  string local_58;
  Text *local_38;
  
  if (in == end || in == (char *)0x0) {
    return in;
  }
  local_38 = (Text *)0x0;
  pcVar4 = parseIdentifier(in,end,&local_38);
  pcVar4 = lookForNextToken<char>(pcVar4,end);
  this_00 = local_38;
  if (local_38 == (Text *)0x0) {
    return pcVar4;
  }
  if (local_38->m_buffer == (char *)0x0) {
LAB_00561f79:
    poVar5 = std::operator<<((ostream *)&std::cerr,"nullptr returned by creating DDLNode.");
    std::endl<char,std::char_traits<char>>(poVar5);
    uVar7 = 0;
    node = (DDLNode *)0x0;
  }
  else {
    std::__cxx11::string::string((string *)&local_80,local_38->m_buffer,(allocator *)&local_58);
    ppDVar3 = (this->m_stack).
              super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if ((this->m_stack).
        super__Vector_base<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>._M_impl.
        super__Vector_impl_data._M_start == ppDVar3) {
      parent = (DDLNode *)0x0;
    }
    else {
      parent = ppDVar3[-1];
    }
    std::__cxx11::string::string((string *)&local_58,"",(allocator *)&local_a0);
    node = DDLNode::create(&local_80,&local_58,parent);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_80);
    if (node == (DDLNode *)0x0) goto LAB_00561f79;
    pushNode(this,node);
    uVar7 = CONCAT71((int7)((ulong)parent >> 8),1);
  }
  Text::~Text(this_00);
  operator_delete(this_00);
  local_58._M_dataplus._M_p = (pointer)0x0;
  pcVar4 = parseName(pcVar4,end,(Name **)&local_58);
  local_a0._M_t.super__Tuple_impl<0UL,_ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>.
  super__Head_base<0UL,_ODDLParser::Name_*,_false>._M_head_impl =
       (tuple<ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>)
       (tuple<ODDLParser::Name_*,_std::default_delete<ODDLParser::Name>_>)local_58._M_dataplus._M_p;
  uVar7 = uVar7 ^ 1;
  if (local_58._M_dataplus._M_p != (pointer)0x0 && (char)uVar7 == '\0') {
    std::__cxx11::string::string
              ((string *)&local_80,*(char **)(*(long *)(local_58._M_dataplus._M_p + 8) + 0x10),
               (allocator *)&local_c0);
    DDLNode::setName(node,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
  }
  local_c0._M_head_impl = (Property *)0x0;
  pcVar4 = lookForNextToken<char>(pcVar4,end);
  if (*pcVar4 == '(') {
    local_b0._M_t.
    super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
    super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
         (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
         (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)0x0;
    local_a8._M_head_impl = (Property *)0x0;
    pcVar4 = pcVar4 + 1;
    local_98 = uVar7;
    local_90 = node;
    local_60 = this;
    while( true ) {
      cVar1 = *pcVar4;
      bVar8 = pcVar4 == end;
      if (bVar8 || cVar1 == ')') break;
      local_88 = (pointer)0x0;
      pcVar4 = parseProperty(pcVar4,end,&local_88);
      std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::reset
                (&local_b0,local_88);
      pcVar4 = lookForNextToken<char>(pcVar4,end);
      __p._M_t.
      super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
      super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
           local_b0._M_t.
           super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
           .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
      cVar2 = *pcVar4;
      if ((cVar2 != ')') && (cVar2 != ',')) {
        std::__cxx11::string::string((string *)&local_80,")",&local_b1);
        logInvalidTokenError(pcVar4,&local_80,local_60->m_logCallback);
        node = local_90;
        uVar7 = local_98;
        std::__cxx11::string::~string((string *)&local_80);
        goto LAB_00562149;
      }
      if (cVar2 != ',' &&
          local_b0._M_t.
          super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
          .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)0x0)
      {
        _Var6._M_head_impl =
             (Property *)
             local_b0._M_t.
             super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
             .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
        if (local_c0._M_head_impl == (Property *)0x0) {
          local_b0._M_t.
          super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
          .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
               (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
               (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
               )0x0;
          std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
          reset((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *
                )&local_c0,
                (pointer)__p._M_t.
                         super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
                         .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl);
          _Var6._M_head_impl =
               (Property *)
               local_b0._M_t.
               super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>
               .super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl;
        }
        if (local_a8._M_head_impl != (Property *)0x0) {
          (local_a8._M_head_impl)->m_next = _Var6._M_head_impl;
          _Var6._M_head_impl = (pointer)0x0;
        }
        local_b0._M_t.
        super__Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>.
        super__Head_base<0UL,_ODDLParser::Property_*,_false>._M_head_impl =
             (tuple<ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
             (_Tuple_impl<0UL,_ODDLParser::Property_*,_std::default_delete<ODDLParser::Property>_>)
             0x0;
        std::__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::
        reset((__uniq_ptr_impl<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
              &local_a8,_Var6._M_head_impl);
      }
    }
    pcVar4 = pcVar4 + 1;
    node = local_90;
    uVar7 = local_98;
LAB_00562149:
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_a8);
    std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
              ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
               &local_b0);
    if (!bVar8 && cVar1 != ')') {
      pcVar4 = (char *)0x0;
      goto LAB_00562184;
    }
  }
  _Var6._M_head_impl = local_c0._M_head_impl;
  if ((char)uVar7 == '\0' && local_c0._M_head_impl != (Property *)0x0) {
    local_c0._M_head_impl = (Property *)0x0;
    DDLNode::setProperties(node,_Var6._M_head_impl);
  }
LAB_00562184:
  std::unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_>::~unique_ptr
            ((unique_ptr<ODDLParser::Property,_std::default_delete<ODDLParser::Property>_> *)
             &local_c0);
  std::unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_>::~unique_ptr
            ((unique_ptr<ODDLParser::Name,_std::default_delete<ODDLParser::Name>_> *)&local_a0);
  return pcVar4;
}

Assistant:

char *OpenDDLParser::parseHeader( char *in, char *end ) {
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    Text *id( ddl_nullptr );
    in = OpenDDLParser::parseIdentifier( in, end, &id );

#ifdef DEBUG_HEADER_NAME
    dumpId( id );
#endif // DEBUG_HEADER_NAME

    in = lookForNextToken( in, end );
    if( ddl_nullptr != id ) {
        // store the node
        DDLNode *node( createDDLNode( id, this ) );
        if( ddl_nullptr != node ) {
            pushNode( node );
        } else {
            std::cerr << "nullptr returned by creating DDLNode." << std::endl;
        }
        delete id;

		Name *name_(ddl_nullptr);
		in = OpenDDLParser::parseName(in, end, &name_);
		std::unique_ptr<Name> name(name_);
        if( ddl_nullptr != name && ddl_nullptr != node ) {
            const std::string nodeName( name->m_id->m_buffer );
            node->setName( nodeName );
        }


		std::unique_ptr<Property> first;
		in = lookForNextToken(in, end);
		if (*in == Grammar::OpenPropertyToken[0]) {
			in++;
			std::unique_ptr<Property> prop, prev;
			while (*in != Grammar::ClosePropertyToken[0] && in != end) {
				Property *prop_(ddl_nullptr);
				in = OpenDDLParser::parseProperty(in, end, &prop_);
				prop.reset(prop_);
				in = lookForNextToken(in, end);

				if (*in != Grammar::CommaSeparator[0] && *in != Grammar::ClosePropertyToken[0]) {
					logInvalidTokenError(in, Grammar::ClosePropertyToken, m_logCallback);
					return ddl_nullptr;
				}

				if (ddl_nullptr != prop && *in != Grammar::CommaSeparator[0]) {
					if (ddl_nullptr == first) {
						first = std::move(prop);
					}
					if (ddl_nullptr != prev) {
						prev->m_next = prop.release();
					}
					prev = std::move(prop);
				}
			}
			++in;
		}

		// set the properties
		if (first && ddl_nullptr != node) {
			node->setProperties(first.release());
		}
    }

    return in;
}